

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_getDualUnboundednessDirection
                   (void *highs,HighsInt *has_dual_unboundedness_direction,
                   double *dual_unboundedness_direction_value)

{
  HighsStatus HVar1;
  uint *in_RSI;
  HighsInt retcode;
  bool v;
  double *in_stack_00000058;
  bool *in_stack_00000060;
  Highs *in_stack_00000068;
  undefined1 local_19;
  
  HVar1 = Highs::getDualUnboundednessDirection
                    (in_stack_00000068,in_stack_00000060,in_stack_00000058);
  *in_RSI = (uint)(local_19 & 1);
  return HVar1;
}

Assistant:

HighsInt Highs_getDualUnboundednessDirection(
    const void* highs, HighsInt* has_dual_unboundedness_direction,
    double* dual_unboundedness_direction_value) {
  bool v;
  HighsInt retcode = (HighsInt)((Highs*)highs)
                         ->getDualUnboundednessDirection(
                             v, dual_unboundedness_direction_value);
  *has_dual_unboundedness_direction = (HighsInt)v;
  return retcode;
}